

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O2

uint32_t __thiscall cppcms::impl::cgi::fastcgi::read_len(fastcgi *this,uchar **p,uchar *e)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  
  pbVar4 = *p;
  if ((pbVar4 < e) && (-1 < (char)*pbVar4)) {
    *p = pbVar4 + 1;
    return (uint32_t)*pbVar4;
  }
  if (3 < (long)e - (long)pbVar4) {
    *p = pbVar4 + 1;
    bVar1 = *pbVar4;
    *p = pbVar4 + 2;
    bVar2 = pbVar4[1];
    *p = pbVar4 + 3;
    bVar3 = pbVar4[2];
    *p = pbVar4 + 4;
    return (uint)bVar3 << 8 | (uint)bVar2 << 0x10 | (bVar1 & 0x7f) << 0x18 | (uint)pbVar4[3];
  }
  return 0xffffffff;
}

Assistant:

uint32_t read_len(unsigned char const *&p,unsigned char const *e)
		{
			if (p<e && *p < 0x80) {
				return *p++;
			}
			else if(e-p >= 4) {
				uint32_t B3=*p++;
				uint32_t B2=*p++;
				uint32_t B1=*p++;
				uint32_t B0=*p++;
				uint32_t len = ((B3 & 0x7fU) << 24) + (B2 << 16) + (B1 << 8) + B0;
				return len;
			}
			else {
				return 0xFFFFFFFFu;
			}
		}